

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O2

StackFrame * __thiscall
moira::Moira::makeFrame<0ull>(StackFrame *__return_storage_ptr__,Moira *this,u32 addr)

{
  u32 pc;
  u16 sr;
  
  pc = (this->reg).pc;
  sr = getSR(this);
  makeFrame<0ull>(__return_storage_ptr__,this,addr,pc,sr,(this->queue).ird);
  return __return_storage_ptr__;
}

Assistant:

StackFrame
Moira::makeFrame(u32 addr)
{
    return makeFrame<F>(addr, getPC(), getSR(), getIRD());
}